

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O2

TextureId __thiscall
solitaire::graphics::SDLGraphicsSystem::loadTexture(SDLGraphicsSystem *this,string *path)

{
  runtime_error *this_00;
  string *in_RDX;
  UniquePtr<SDL_Texture> UStack_68;
  UniquePtr<SDL_Surface> local_40;
  
  if (path[3].field_2._M_local_buf[9] != '\0') {
    createSDLSurfaceOrThrow(&local_40,(SDLGraphicsSystem *)path,in_RDX);
    createSDLTextureOrThrow(&UStack_68,(SDLGraphicsSystem *)path,&local_40);
    std::
    vector<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>,std::allocator<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>>
    ::emplace_back<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>
              ((vector<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>,std::allocator<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>>>
                *)(path + 3),&UStack_68);
    std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>::~unique_ptr(&UStack_68);
    std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>::~unique_ptr(&local_40);
    *(int *)&(this->super_GraphicsSystem)._vptr_GraphicsSystem =
         (int)((long)(path[3]._M_string_length - (long)path[3]._M_dataplus._M_p) / 0x28) + -1;
    return (TextureId)(uint)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot load texture when window not created");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TextureId SDLGraphicsSystem::loadTexture(const std::string& path) {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot load texture when window not created"};

    textures.emplace_back(createSDLTextureOrThrow(createSDLSurfaceOrThrow(path)));

    return TextureId {static_cast<unsigned>(textures.size() - 1)};
}